

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

bool __thiscall
kwssys::Glob::RecurseDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pRVar1;
  bool bVar2;
  bool bVar3;
  Status SVar4;
  unsigned_long uVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong dindex;
  bool bVar8;
  string realPathErrorMessage;
  Directory d;
  string realname;
  string message;
  string canonicalPath;
  string fname;
  string errorMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  Directory local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  size_type local_148;
  size_type local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_140 = start;
  Directory::Directory(&local_170);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  SVar4 = Directory::Load(&local_170,dir,&local_90);
  if (SVar4.Kind_ == Success) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    local_168._M_string_length = 0;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    dindex = 0;
    local_168.field_2._M_local_buf[0] = '\0';
    local_d0.field_2._M_local_buf[0] = '\0';
    local_148 = local_140 + 1;
    this_00 = &this->VisitedSymlinks;
    while( true ) {
      uVar5 = Directory::GetNumberOfFiles(&local_170);
      bVar8 = uVar5 <= dindex;
      if (bVar8) break;
      Directory::GetFile(&local_170,dindex);
      std::__cxx11::string::assign((char *)&local_d0);
      bVar2 = std::operator==(&local_d0,".");
      if ((!bVar2) && (bVar2 = std::operator==(&local_d0,".."), !bVar2)) {
        if (local_140 == 0) {
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
          std::operator+(pbVar7,dir,&local_d0);
          std::__cxx11::string::operator=((string *)&local_168,(string *)pbVar7);
        }
        else {
          pbVar7 = &local_190;
          std::operator+(pbVar7,dir,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,pbVar7,&local_d0);
          std::__cxx11::string::operator=((string *)&local_168,(string *)local_f8);
          std::__cxx11::string::~string((string *)local_f8);
        }
        std::__cxx11::string::~string((string *)pbVar7);
        bVar2 = Directory::FileIsDirectory(&local_170,dindex);
        bVar3 = Directory::FileIsSymlink(&local_170,dindex);
        if (bVar2) {
          if (bVar3) {
            if (this->RecurseThroughSymlinks != true) goto LAB_0014b3bb;
            this->FollowedSymlinkCount = this->FollowedSymlinkCount + 1;
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            local_190._M_string_length = 0;
            local_190.field_2._M_local_buf[0] = '\0';
            SystemTools::GetRealPath(&local_118,dir,&local_190);
            if (local_190._M_string_length != 0) {
              if (messages != (GlobMessages *)0x0) {
                std::operator+(&local_70,"Canonical path generation from path \'",dir);
                std::operator+(&local_50,&local_70,"\' failed! Reason: \'");
                std::operator+(&local_b0,&local_50,&local_190);
                std::operator+(&local_138,&local_b0,"\'");
                local_f8._0_4_ = error;
                std::__cxx11::string::string((string *)(local_f8 + 8),(string *)&local_138);
                std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::
                emplace_back<kwssys::Glob::Message>(messages,(Message *)local_f8);
                std::__cxx11::string::~string((string *)(local_f8 + 8));
                std::__cxx11::string::~string((string *)&local_138);
                std::__cxx11::string::~string((string *)&local_b0);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_70);
              }
LAB_0014b643:
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&local_190);
              break;
            }
            _Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((this->VisitedSymlinks).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (this->VisitedSymlinks).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,&local_118);
            pbVar7 = (this->VisitedSymlinks).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (_Var6._M_current == pbVar7) {
              if (this->RecurseListDirs == true) {
                AddFile(this,&this->Internals->Files,&local_168);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this_00,&local_118);
              bVar2 = RecurseDirectory(this,local_148,&local_168,messages);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(this_00);
              if (!bVar2) goto LAB_0014b643;
            }
            else if (messages != (GlobMessages *)0x0) {
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              local_138._M_string_length = 0;
              local_138.field_2._M_local_buf[0] = '\0';
              for (_Var6 = std::
                           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                     ((this_00->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start,pbVar7,&local_118);
                  _Var6._M_current !=
                  (this->VisitedSymlinks).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
                  _Var6._M_current = _Var6._M_current + 1) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f8,_Var6._M_current,"\n");
                std::__cxx11::string::append((string *)&local_138);
                std::__cxx11::string::~string((string *)local_f8);
              }
              std::operator+(&local_b0,&local_118,"/");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f8,&local_b0,&local_d0);
              std::__cxx11::string::append((string *)&local_138);
              std::__cxx11::string::~string((string *)local_f8);
              std::__cxx11::string::~string((string *)&local_b0);
              local_f8._0_4_ = cyclicRecursion;
              std::__cxx11::string::string((string *)(local_f8 + 8),(string *)&local_138);
              std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::
              emplace_back<kwssys::Glob::Message>(messages,(Message *)local_f8);
              std::__cxx11::string::~string((string *)(local_f8 + 8));
              std::__cxx11::string::~string((string *)&local_138);
            }
            std::__cxx11::string::~string((string *)&local_118);
            std::__cxx11::string::~string((string *)&local_190);
          }
          else {
            if (this->RecurseListDirs == true) {
              AddFile(this,&this->Internals->Files,&local_168);
            }
            bVar2 = RecurseDirectory(this,local_148,&local_168,messages);
            if (!bVar2) break;
          }
        }
        else {
LAB_0014b3bb:
          pRVar1 = (this->Internals->Expressions).
                   super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((this->Internals->Expressions).
               super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_start != pRVar1) &&
             (bVar8 = RegularExpression::find(pRVar1 + -1,local_d0._M_dataplus._M_p), bVar8)) {
            AddFile(this,&this->Internals->Files,&local_168);
          }
        }
      }
      dindex = dindex + 1;
    }
    std::__cxx11::string::~string((string *)&local_d0);
    pbVar7 = &local_168;
  }
  else {
    bVar8 = true;
    if ((messages == (GlobMessages *)0x0) || (local_90._M_string_length == 0)) goto LAB_0014b671;
    std::operator+(&local_118,"Error listing directory \'",dir);
    std::operator+(&local_190,&local_118,"\'! Reason: \'");
    std::operator+(&local_d0,&local_190,&local_90);
    std::operator+(&local_168,&local_d0,"\'");
    local_f8._0_4_ = warning;
    std::__cxx11::string::string((string *)(local_f8 + 8),(string *)&local_168);
    std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::
    emplace_back<kwssys::Glob::Message>(messages,(Message *)local_f8);
    std::__cxx11::string::~string((string *)(local_f8 + 8));
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_190);
    pbVar7 = &local_118;
  }
  std::__cxx11::string::~string((string *)pbVar7);
LAB_0014b671:
  std::__cxx11::string::~string((string *)&local_90);
  Directory::~Directory(&local_170);
  return bVar8;
}

Assistant:

bool Glob::RecurseDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  kwsys::Directory d;
  std::string errorMessage;
  if (!d.Load(dir, &errorMessage)) {
    if (messages) {
      if (!errorMessage.empty()) {
        messages->push_back(Message(Glob::warning,
                                    "Error listing directory '" + dir +
                                      "'! Reason: '" + errorMessage + "'"));
      }
    }
    return true;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On Windows and Apple, no difference between lower and upper case
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    bool isDir = d.FileIsDirectory(cc);
    bool isSymLink = d.FileIsSymlink(cc);

    if (isDir && (!isSymLink || this->RecurseThroughSymlinks)) {
      if (isSymLink) {
        ++this->FollowedSymlinkCount;
        std::string realPathErrorMessage;
        std::string canonicalPath(
          SystemTools::GetRealPath(dir, &realPathErrorMessage));

        if (!realPathErrorMessage.empty()) {
          if (messages) {
            messages->push_back(
              Message(Glob::error,
                      "Canonical path generation from path '" + dir +
                        "' failed! Reason: '" + realPathErrorMessage + "'"));
          }
          return false;
        }

        if (std::find(this->VisitedSymlinks.begin(),
                      this->VisitedSymlinks.end(),
                      canonicalPath) == this->VisitedSymlinks.end()) {
          if (this->RecurseListDirs) {
            // symlinks are treated as directories
            this->AddFile(this->Internals->Files, realname);
          }

          this->VisitedSymlinks.push_back(canonicalPath);
          if (!this->RecurseDirectory(start + 1, realname, messages)) {
            this->VisitedSymlinks.pop_back();

            return false;
          }
          this->VisitedSymlinks.pop_back();
        }
        // else we have already visited this symlink - prevent cyclic recursion
        else if (messages) {
          std::string message;
          for (std::vector<std::string>::const_iterator pathIt =
                 std::find(this->VisitedSymlinks.begin(),
                           this->VisitedSymlinks.end(), canonicalPath);
               pathIt != this->VisitedSymlinks.end(); ++pathIt) {
            message += *pathIt + "\n";
          }
          message += canonicalPath + "/" + fname;
          messages->push_back(Message(Glob::cyclicRecursion, message));
        }
      } else {
        if (this->RecurseListDirs) {
          this->AddFile(this->Internals->Files, realname);
        }
        if (!this->RecurseDirectory(start + 1, realname, messages)) {
          return false;
        }
      }
    } else {
      if (!this->Internals->Expressions.empty() &&
          this->Internals->Expressions.back().find(fname)) {
        this->AddFile(this->Internals->Files, realname);
      }
    }
  }

  return true;
}